

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

int Kit_TruthBestCofVar(uint *pTruth,int nVars,uint *pCof0,uint *pCof1)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar;
  ulong uVar5;
  ulong uVar6;
  int Counter;
  int iVar_00;
  int iVar7;
  int i;
  int iVar8;
  int Counter_1;
  
  uVar5 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar5 = 1;
  }
  iVar_00 = -1;
  uVar6 = uVar5;
  do {
    iVar2 = (int)uVar6;
    if (iVar2 < 1) {
      return -1;
    }
    lVar1 = uVar6 - 1;
    uVar6 = uVar6 - 1;
  } while (pTruth[lVar1] == 0);
  if (0 < iVar2) {
    do {
      iVar2 = (int)uVar5;
      if (iVar2 < 1) {
        return -1;
      }
      lVar1 = uVar5 - 1;
      uVar5 = uVar5 - 1;
    } while (pTruth[lVar1] == 0xffffffff);
    if (0 < iVar2) {
      iVar_00 = -1;
      if (0 < nVars) {
        iVar = 0;
        iVar2 = 100000000;
        do {
          Kit_TruthCofactor0New(pCof0,pTruth,nVars,iVar);
          Kit_TruthCofactor1New(pCof1,pTruth,nVars,iVar);
          iVar7 = 0;
          iVar8 = 0;
          do {
            iVar3 = Kit_TruthVarInSupport(pCof0,nVars,iVar8);
            iVar7 = iVar7 + iVar3;
            iVar8 = iVar8 + 1;
          } while (nVars != iVar8);
          iVar8 = 0;
          iVar3 = 0;
          do {
            iVar4 = Kit_TruthVarInSupport(pCof1,nVars,iVar3);
            iVar8 = iVar8 + iVar4;
            iVar3 = iVar3 + 1;
          } while (nVars != iVar3);
          iVar8 = iVar8 + iVar7;
          if (iVar8 < iVar2) {
            iVar_00 = iVar;
          }
          if (iVar8 <= iVar2) {
            iVar2 = iVar8;
          }
          iVar = iVar + 1;
        } while (iVar != nVars);
      }
      if (iVar_00 == -1) {
        __assert_fail("iBestVar != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x56c,
                      "int Kit_TruthBestCofVar(unsigned int *, int, unsigned int *, unsigned int *)"
                     );
      }
      Kit_TruthCofactor0New(pCof0,pTruth,nVars,iVar_00);
      Kit_TruthCofactor1New(pCof1,pTruth,nVars,iVar_00);
    }
  }
  return iVar_00;
}

Assistant:

int Kit_TruthBestCofVar( unsigned * pTruth, int nVars, unsigned * pCof0, unsigned * pCof1 )
{
    int i, iBestVar, nSuppSizeCur0, nSuppSizeCur1, nSuppSizeCur, nSuppSizeMin;
    if ( Kit_TruthIsConst0(pTruth, nVars) || Kit_TruthIsConst1(pTruth, nVars) )
        return -1;
    // iterate through variables
    iBestVar = -1;
    nSuppSizeMin = KIT_INFINITY;
    for ( i = 0; i < nVars; i++ )
    {
        // cofactor the functiona and get support sizes
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        nSuppSizeCur0 = Kit_TruthSupportSize( pCof0, nVars );
        nSuppSizeCur1 = Kit_TruthSupportSize( pCof1, nVars );
        nSuppSizeCur  = nSuppSizeCur0 + nSuppSizeCur1;
        // compare this variable with other variables
        if ( nSuppSizeMin > nSuppSizeCur ) 
        {
            nSuppSizeMin = nSuppSizeCur;
            iBestVar = i;
        }
    }
    assert( iBestVar != -1 );
    // cofactor w.r.t. this variable
    Kit_TruthCofactor0New( pCof0, pTruth, nVars, iBestVar );
    Kit_TruthCofactor1New( pCof1, pTruth, nVars, iBestVar );
    return iBestVar;
}